

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_SockAddr.cpp
# Opt level: O0

void axl::io::createSockAddrNetMask_ip4(sockaddr_in *addr,size_t bitCount)

{
  ulong in_RSI;
  undefined2 *in_RDI;
  size_t maxBitCount;
  
  memset(in_RDI,0,0x10);
  *in_RDI = 2;
  if (0x20 < in_RSI) {
    in_RSI = 0x20;
  }
  sl::setBitRange((size_t *)maxBitCount,(size_t)in_RDI,in_RSI,0x20);
  return;
}

Assistant:

void
createSockAddrNetMask_ip4(
	sockaddr_in* addr,
	size_t bitCount
) {
	memset(addr, 0, sizeof(sockaddr_in));
	addr->sin_family = AF_INET;

	size_t maxBitCount = sizeof(addr->sin_addr) * 8;
	if (bitCount > maxBitCount)
		bitCount = maxBitCount;

	sl::setBitRange((size_t*)&addr->sin_addr, 1, 0, bitCount);
}